

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskHandle::tryOpenSubdir(DiskHandle *this,PathPtr path)

{
  ReadableDirectory *pRVar1;
  ReadableDirectory *extraout_RDX;
  Maybe<kj::Own<kj::ReadableDirectory,_std::nullptr_t>_> MVar2;
  Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_> MVar3;
  DiskHandle local_28;
  OwnFd local_24;
  NullableValue<kj::OwnFd> local_20;
  undefined8 local_18;
  
  tryOpenSubdirInternal(&local_28,path);
  MVar2 = Maybe<kj::OwnFd>::map<kj::Own<kj::ReadableDirectory,_std::nullptr_t>_(&)(kj::OwnFd)>
                    ((Maybe<kj::OwnFd> *)&local_20,
                     (_func_Own<kj::ReadableDirectory,_std::nullptr_t>_OwnFd *)&local_28);
  pRVar1 = MVar2.ptr.ptr;
  *(NullableValue<kj::OwnFd> *)this = local_20;
  *(undefined8 *)(this + 2) = local_18;
  local_18 = 0;
  if ((char)local_28.fd.fd == '\x01') {
    OwnFd::~OwnFd(&local_24);
    pRVar1 = extraout_RDX;
  }
  MVar3.ptr.ptr = pRVar1;
  MVar3.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::ReadableDirectory,_std::nullptr_t>_>)MVar3.ptr;
}

Assistant:

Maybe<Own<const ReadableDirectory>> tryOpenSubdir(PathPtr path) const {
    return tryOpenSubdirInternal(path).map(newDiskReadableDirectory);
  }